

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteInlineImport(WatWriter *this,ExternalKind kind,Index index)

{
  pointer ppIVar1;
  Import *pIVar2;
  
  if (this->options_->inline_import == true) {
    ppIVar1 = this->inline_import_map_[kind].
              super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)index <
        (ulong)((long)this->inline_import_map_[kind].
                      super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1 >> 3)) {
      pIVar2 = ppIVar1[index];
      WritePuts(this,"(",None);
      WritePuts(this,"import",Space);
      this->indent_ = this->indent_ + 2;
      WriteQuotedData(this,(pIVar2->module_name)._M_dataplus._M_p,
                      *(size_type *)((long)&pIVar2->module_name + 8));
      this->next_char_ = Space;
      WriteQuotedData(this,(pIVar2->field_name)._M_dataplus._M_p,
                      *(size_type *)((long)&pIVar2->field_name + 8));
      this->next_char_ = Space;
      WriteClose(this,Space);
      return;
    }
  }
  return;
}

Assistant:

void WatWriter::WriteInlineImport(ExternalKind kind, Index index) {
  if (!options_.inline_import) {
    return;
  }

  size_t kind_index = static_cast<size_t>(kind);

  if (index >= inline_import_map_[kind_index].size()) {
    return;
  }

  const Import* import = inline_import_map_[kind_index][index];
  WriteOpenSpace("import");
  WriteQuotedString(import->module_name, NextChar::Space);
  WriteQuotedString(import->field_name, NextChar::Space);
  WriteCloseSpace();
}